

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structured_bindings.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer ppVar4;
  pointer ppVar5;
  ulong uVar6;
  pointer pdVar7;
  ostream *poVar8;
  long lVar9;
  ulong uVar10;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  __i;
  long lVar11;
  pointer ppVar12;
  pointer puVar13;
  undefined1 auVar14 [16];
  initializer_list<double> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  double local_118;
  vector<double,_std::allocator<double>_> elements;
  vector<double,_std::allocator<double>_> values;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  enumeratedElements;
  tuple<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> originalIndices;
  tuple<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0x3ff0000000000000;
  local_58.
  super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>.
  _M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xbfb999999999999a;
  local_58.
  super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Head_base<0UL,_double,_false>._M_head_impl = -0.2;
  local_58.
  super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>.
  _M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3ff3333333333333;
  local_58.
  super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>.
  _M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3ff199999999999a;
  __l._M_len = 6;
  __l._M_array = (iterator)&local_58;
  std::vector<double,_std::allocator<double>_>::vector(&elements,__l,(allocator_type *)&local_b8);
  std::operator<<((ostream *)&std::cout,"elements=");
  printVector<double>(&elements);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_b8.
  super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>.
  _M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>.
  _M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>.
  _M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>.
  _M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>.
  _M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>.
  _M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  super__Head_base<0UL,_double,_false>._M_head_impl = NAN;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58);
  lVar9 = (long)elements.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)elements.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar10 = (long)elements.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)elements.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar10 != 0) {
    enumeratedElements.
    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    enumeratedElements.
    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    enumeratedElements.
    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (local_58.
         super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         .super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
         super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>.
         _M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start = (pointer)0x0;
        ppVar5 = enumeratedElements.
                 super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        ppVar4 = enumeratedElements.
                 super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        local_58.
        super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>.
        _M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start <
        (pointer)((long)elements.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)elements.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3);
        local_58.
        super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>.
        _M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)local_58.
                             super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             .
                             super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             .
                             super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>
                             ._M_head_impl.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + 1)) {
      std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>::
      emplace_back<unsigned_long&,double_const&>
                ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                  *)&enumeratedElements,(unsigned_long *)&local_58,
                 elements.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start +
                 (long)local_58.
                       super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       .
                       super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       .
                       super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>
                       ._M_head_impl.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start);
    }
    if (enumeratedElements.
        super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        enumeratedElements.
        super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar11 = (long)enumeratedElements.
                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)enumeratedElements.
                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = lVar11 >> 4;
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::operator()(enumeratedElements.
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      enumeratedElements.
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar11 < 0x101) {
        std::operator()(ppVar4,ppVar5);
      }
      else {
        ppVar12 = ppVar4 + 0x10;
        std::operator()(ppVar4,ppVar12);
        for (; ppVar12 != ppVar5; ppVar12 = ppVar12 + 1) {
          std::operator()(ppVar12);
        }
      }
    }
    originalIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((ulong)(lVar9 >> 3) >> 1);
    if ((uVar10 & 8) == 0) {
      local_58.
      super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>.
      _M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)originalIndices.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start - 1);
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_58;
      local_58.
      super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      super__Tuple_impl<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      super__Head_base<1UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false>.
      _M_head_impl.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           originalIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&indices,__l_00,(allocator_type *)&values);
    }
    else {
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&originalIndices;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&indices,__l_01,(allocator_type *)&values);
    }
    originalIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    originalIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    originalIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    for (puVar13 = indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_start;
        pdVar3 = values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,
        pdVar2 = values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
        puVar13 !=
        indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish; puVar13 = puVar13 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&originalIndices,
                 &enumeratedElements.
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*puVar13].first);
      std::vector<double,_std::allocator<double>_>::push_back
                (&values,&enumeratedElements.
                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[*puVar13].second);
    }
    local_118 = 0.0;
    for (pdVar7 = values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar7 != values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar7 = pdVar7 + 1) {
      local_118 = local_118 + *pdVar7;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,&originalIndices);
    lVar9 = (long)pdVar3 - (long)pdVar2 >> 3;
    auVar14._8_4_ = (int)((long)pdVar3 - (long)pdVar2 >> 0x23);
    auVar14._0_8_ = lVar9;
    auVar14._12_4_ = 0x45300000;
    local_58.
    super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    super__Head_base<0UL,_double,_false>._M_head_impl =
         local_118 /
         ((auVar14._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
    std::tuple<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::operator=
              (&local_b8,&local_58);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&values.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&originalIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::
    _Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
    ::~_Vector_base(&enumeratedElements.
                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                   );
  }
  std::operator<<((ostream *)&std::cout,"median_value=");
  poVar8 = std::ostream::_M_insert<double>
                     (local_b8.
                      super__Tuple_impl<0UL,_double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      .super__Head_base<0UL,_double,_false>._M_head_impl);
  std::operator<<(poVar8," ");
  std::operator<<((ostream *)&std::cout,"indices=");
  printVector<unsigned_long>((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&elements.super__Vector_base<double,_std::allocator<double>_>);
  return 0;
}

Assistant:

int main()
{
    // Let's create an vector of floats to run our algorithm on.
    const std::vector<double> elements {
        1.2, 1.1, -0.1, -0.2, 0, 1
        };

    {
        // Print out the values.
        std::cout << "elements=";
        printVector(elements);
        std::cout << std::endl;
    }

    // At this point we declare what we want - constant value variables
    // "median_value" and indices. They are returned from the lambda and
    // unpacked by means of a structured binding into separate variables
    // right in the current scope.
    // Please notice that we do not capture "elements" into lambda's
    // capture list. A reference (&) capture list enables non-const access
    // to the outer-scope "elements". If for some reason "elements" are
    // declared non-const, lambda's body may by mistake modify its contents.
    // Instead we pass elements as a const reference parameter.
    const auto [median_value, indices] = [](const std::vector<double>& elements)
    {
        // Inside the lambda we allow ourselves some non-functional style by
        // initializing the result variable with a default value which is
        // a tuple of NaN and an empty list to account for possible
        // empty input list.
        auto result = std::make_tuple(
            std::numeric_limits<double>::quiet_NaN(),
            std::vector<size_t>());

        auto size = elements.size();

        if (size > 0)
        {
            // To keep track of the indices which were used to calculate
            // a median, we enumerate elements much alike in python.
            std::vector<std::pair<size_t, double> > enumeratedElements;
            for (size_t index = 0; index < elements.size(); ++index)
            {
                enumeratedElements.emplace_back(index, elements[index]);
            }

            // Now we are all set to sort the elements by values which
            // are stored in "second" field of a tuple.
            std::sort(enumeratedElements.begin(), enumeratedElements.end(),
                [](auto a, auto b){ return a.second > b.second; });

            // A median is calculated out of a middle element of odd-sized
            // lists and out of the two middle elements of an even-sized list.
            std::vector<size_t> indices = (size % 2 == 0) ?
                std::vector<size_t>{size / 2 - 1, size / 2} :
                std::vector<size_t>{size / 2};

            // Let's disentangle indices and values back from the tuples
            // that we are interested in.
            std::vector<size_t> originalIndices;
            std::vector<double> values;
            for (const auto& index : indices)
            {
                originalIndices.push_back(enumeratedElements[index].first);
                values.push_back(enumeratedElements[index].second);
            }

            // Here we stick to the functional paradigm again to mean-reduce
            // one or two values of interest.
            auto median = std::accumulate(values.begin(), values.end(), 0.0) /
                values.size();

            // And return a tuple to be unpacked with a structured binding.
            result = std::make_tuple(median, originalIndices);
        }
        return result;
    }(elements); // Our lambda is one-time use, so just call it.

    // ....... long code here .........

    // By mistake we try to reuse short variable names,
    // but therefore overwrite the original values

    // median_value = 12.3; // Does not compile
    // indices = std::vector<size_t>{100, 200}; // Does not compile

    // Voila! Our fancy const structured bindings save us from a bug,
    // and this happens at compile stage, not after a couple of hours
    // of debugging.

    // ....... more code here .........

    // At some point we again need the original "median_value" or "indices".
    // It is safe to assume that the values are never corrupted
    // thanks to the const qualifier.

    {
        // Print out the results.
        std::cout << "median_value=" << median_value << " ";
        std::cout << "indices=";
        printVector(indices);
        std::cout << std::endl;
    }

    return 0;
}